

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Type *this;
  ulong uVar4;
  
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                       *)fromType.d_ptr);
  uVar4 = 0;
  uVar2 = 0;
  if ((fromType.d_ptr != (QMetaTypeInterface *)0x0) &&
     (uVar2 = ((fromType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar2 == 0)) {
    uVar2 = registerHelper(fromType.d_ptr);
  }
  if ((toType.d_ptr != (QMetaTypeInterface *)0x0) &&
     (uVar3 = ((toType.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i, uVar4 = (ulong)uVar3,
     uVar3 == 0)) {
    uVar3 = registerHelper(toType.d_ptr);
    uVar4 = (ulong)uVar3;
  }
  bVar1 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
          ::contains(this,(pair<int,_int>)((ulong)uVar2 | uVar4 << 0x20));
  return bVar1;
}

Assistant:

bool QMetaType::hasRegisteredConverterFunction(QMetaType fromType, QMetaType toType)
{
    return customTypesConversionRegistry()->contains({fromType.id(), toType.id()});
}